

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter>_>::dispose
          (Own<kj::_::AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter>_> *this)

{
  AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *object;
  AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *ptrCopy;
  Own<kj::_::AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter>_> *this_local;
  
  object = this->ptr;
  if (object != (AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *)0x0) {
    this->ptr = (AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *)0x0;
    Disposer::dispose<kj::_::AdapterPromiseNode<int,kj::UnixEventPort::ChildExitPromiseAdapter>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }